

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> * __thiscall
vkt::shaderexecutor::
generateInputs<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>
          (Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>
           *__return_storage_ptr__,shaderexecutor *this,
          Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>
          *samplings,FloatFormat *floatFormat,Precision intPrecision,size_t numSamples,deUint32 seed
          )

{
  iterator iVar1;
  iterator iVar2;
  undefined4 uVar3;
  shaderexecutor *psVar4;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> *pSVar5;
  void *pvVar6;
  void *pvVar7;
  const_iterator cVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  In2 in2;
  In1 in1;
  In0 in0;
  In3 in3;
  InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> tuple;
  Inputs<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> fixedInputs;
  set<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>_>
  seenInputs;
  Random rnd;
  float local_128;
  float local_124;
  float local_120;
  Void local_119;
  undefined1 local_118 [16];
  vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *local_108;
  vector<float,std::allocator<float>> *local_100;
  vector<float,std::allocator<float>> *local_f8;
  undefined4 local_ec;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  void *pvStack_d0;
  void *local_c8;
  long lStack_c0;
  void *local_b8;
  void *pvStack_b0;
  long local_a8;
  void *pvStack_a0;
  void *local_98;
  long lStack_90;
  long local_88;
  shaderexecutor *local_80;
  Samplings<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_> *local_78
  ;
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>_>
  local_70;
  deRandom local_40;
  
  local_88 = CONCAT44(in_register_00000084,intPrecision);
  deRandom_init(&local_40,(deUint32)numSamples);
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in3).
  super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = (void *)0x0;
  lStack_90 = 0;
  local_a8 = 0;
  pvStack_a0 = (void *)0x0;
  local_b8 = (void *)0x0;
  pvStack_b0 = (void *)0x0;
  local_c8 = (void *)0x0;
  lStack_c0 = 0;
  local_d8 = 0;
  pvStack_d0 = (void *)0x0;
  local_e8 = (void *)0x0;
  pvStack_e0 = (void *)0x0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_70._M_impl.super__Rb_tree_header._M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right =
       local_70._M_impl.super__Rb_tree_header._M_header._M_left;
  (**(code **)**(undefined8 **)this)(*(undefined8 **)this,samplings);
  (**(code **)**(undefined8 **)(this + 8))(*(undefined8 **)(this + 8),samplings,&pvStack_d0);
  (**(code **)**(undefined8 **)(this + 0x10))(*(undefined8 **)(this + 0x10),samplings,&local_b8);
  (**(code **)**(undefined8 **)(this + 0x18))(*(undefined8 **)(this + 0x18),samplings,&pvStack_a0);
  local_ec = SUB84(floatFormat,0);
  local_80 = this;
  local_78 = samplings;
  if (pvStack_e0 != local_e8) {
    local_f8 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in1;
    local_100 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in2;
    local_108 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    uVar18 = 0;
    pvVar7 = pvStack_d0;
    pvVar10 = local_c8;
    pvVar6 = local_e8;
    pvVar9 = pvStack_e0;
    pvVar15 = local_c8;
    do {
      bVar19 = pvVar15 != pvVar7;
      pvVar15 = pvVar7;
      if (bVar19) {
        uVar16 = 0;
        pvVar11 = local_b8;
        pvVar13 = pvStack_b0;
        pvVar14 = pvStack_b0;
        do {
          bVar19 = pvVar14 != pvVar11;
          pvVar14 = pvVar11;
          if (bVar19) {
            uVar17 = 0;
            pvVar6 = pvStack_a0;
            pvVar9 = local_98;
            do {
              bVar19 = pvVar9 != pvVar6;
              pvVar9 = pvVar6;
              if (bVar19) {
                uVar12 = 0;
                do {
                  local_118._0_4_ = *(float *)((long)local_e8 + uVar18 * 4);
                  local_118._4_4_ = *(float *)((long)pvStack_d0 + uVar16 * 4);
                  local_118._8_4_ = *(float *)((long)local_b8 + uVar17 * 4);
                  std::
                  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>>
                  ::
                  _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>const&>
                            ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>>
                              *)&local_70,
                             (InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>
                              *)local_118);
                  iVar1._M_current =
                       (__return_storage_ptr__->in0).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in0).
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)__return_storage_ptr__,iVar1,
                               (float *)local_118);
                  }
                  else {
                    *iVar1._M_current = (float)local_118._0_4_;
                    (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in1).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in1).
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              (local_f8,iVar1,(float *)(local_118 + 4));
                  }
                  else {
                    *iVar1._M_current = (float)local_118._4_4_;
                    (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar1._M_current =
                       (__return_storage_ptr__->in2).
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar1._M_current ==
                      (__return_storage_ptr__->in2).
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              (local_100,iVar1,(float *)(local_118 + 8));
                  }
                  else {
                    *iVar1._M_current = (float)local_118._8_4_;
                    (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
                  }
                  iVar2._M_current =
                       (__return_storage_ptr__->in3).
                       super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar2._M_current ==
                      (__return_storage_ptr__->in3).
                      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>
                    ::_M_realloc_insert<vkt::shaderexecutor::Void_const&>
                              (local_108,iVar2,(Void *)(local_118 + 0xc));
                  }
                  else {
                    (__return_storage_ptr__->in3).
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                  }
                  uVar12 = uVar12 + 1;
                  pvVar6 = pvStack_a0;
                  pvVar9 = local_98;
                  pvVar11 = local_b8;
                  pvVar13 = pvStack_b0;
                } while (uVar12 < (ulong)((long)local_98 - (long)pvStack_a0));
              }
              uVar17 = uVar17 + 1;
              pvVar7 = pvStack_d0;
              pvVar10 = local_c8;
              pvVar14 = pvVar13;
            } while (uVar17 < (ulong)((long)pvVar13 - (long)pvVar11 >> 2));
          }
          uVar16 = uVar16 + 1;
          pvVar6 = local_e8;
          pvVar9 = pvStack_e0;
          pvVar15 = pvVar10;
        } while (uVar16 < (ulong)((long)pvVar10 - (long)pvVar7 >> 2));
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)pvVar9 - (long)pvVar6 >> 2));
  }
  pSVar5 = local_78;
  psVar4 = local_80;
  uVar3 = local_ec;
  if (local_88 != 0) {
    local_f8 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in1;
    local_100 = (vector<float,std::allocator<float>> *)&__return_storage_ptr__->in2;
    local_108 = (vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>> *)
                &__return_storage_ptr__->in3;
    do {
      local_120 = (float)(**(code **)(**(long **)psVar4 + 8))
                                   (*(long **)psVar4,pSVar5,uVar3,&local_40);
      local_124 = (float)(**(code **)(**(long **)(psVar4 + 8) + 8))
                                   (*(long **)(psVar4 + 8),pSVar5,uVar3,&local_40);
      local_128 = (float)(**(code **)(**(long **)(psVar4 + 0x10) + 8))
                                   (*(long **)(psVar4 + 0x10),pSVar5,uVar3,&local_40);
      (**(code **)(**(long **)(psVar4 + 0x18) + 8))
                (*(long **)(psVar4 + 0x18),pSVar5,uVar3,&local_40);
      local_118._0_4_ = local_120;
      local_118._4_4_ = local_124;
      local_118._8_4_ = local_128;
      cVar8 = std::
              _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>_>
              ::find(&local_70,(key_type *)local_118);
      if ((_Rb_tree_header *)cVar8._M_node == &local_70._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>>
        ::
        _M_insert_unique<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>const&>
                  ((_Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>,std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>,std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,float,float,vkt::shaderexecutor::Void>>>>
                    *)&local_70,(key_type *)local_118);
        iVar1._M_current =
             (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)__return_storage_ptr__,iVar1,&local_120)
          ;
        }
        else {
          *iVar1._M_current = local_120;
          (__return_storage_ptr__->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_f8,iVar1,&local_124);
        }
        else {
          *iVar1._M_current = local_124;
          (__return_storage_ptr__->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_100,iVar1,&local_128);
        }
        else {
          *iVar1._M_current = local_128;
          (__return_storage_ptr__->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar2._M_current =
             (__return_storage_ptr__->in3).
             super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->in3).
            super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::shaderexecutor::Void,std::allocator<vkt::shaderexecutor::Void>>::
          _M_realloc_insert<vkt::shaderexecutor::Void_const&>(local_108,iVar2,&local_119);
        }
        else {
          (__return_storage_ptr__->in3).
          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
      }
      local_88 = local_88 + -1;
    } while (local_88 != 0);
  }
  std::
  _Rb_tree<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>,_std::_Identity<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_vkt::shaderexecutor::InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>,_std::allocator<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<float,_float,_float,_vkt::shaderexecutor::Void>_>_>_>
  ::~_Rb_tree(&local_70);
  if (pvStack_a0 != (void *)0x0) {
    operator_delete(pvStack_a0,lStack_90 - (long)pvStack_a0);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  if (pvStack_d0 != (void *)0x0) {
    operator_delete(pvStack_d0,lStack_c0 - (long)pvStack_d0);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

Inputs<In> generateInputs (const Samplings<In>&	samplings,
						   const FloatFormat&	floatFormat,
						   Precision			intPrecision,
						   size_t				numSamples,
						   deUint32				seed)
{
	Random										rnd(seed);
	Inputs<In>									ret;
	Inputs<In>									fixedInputs;
	set<InTuple<In>, InputLess<InTuple<In> > >	seenInputs;

	samplings.in0.genFixeds(floatFormat, fixedInputs.in0);
	samplings.in1.genFixeds(floatFormat, fixedInputs.in1);
	samplings.in2.genFixeds(floatFormat, fixedInputs.in2);
	samplings.in3.genFixeds(floatFormat, fixedInputs.in3);

	for (size_t ndx0 = 0; ndx0 < fixedInputs.in0.size(); ++ndx0)
	{
		for (size_t ndx1 = 0; ndx1 < fixedInputs.in1.size(); ++ndx1)
		{
			for (size_t ndx2 = 0; ndx2 < fixedInputs.in2.size(); ++ndx2)
			{
				for (size_t ndx3 = 0; ndx3 < fixedInputs.in3.size(); ++ndx3)
				{
					const InTuple<In>	tuple	(fixedInputs.in0[ndx0],
												 fixedInputs.in1[ndx1],
												 fixedInputs.in2[ndx2],
												 fixedInputs.in3[ndx3]);

					seenInputs.insert(tuple);
					ret.in0.push_back(tuple.a);
					ret.in1.push_back(tuple.b);
					ret.in2.push_back(tuple.c);
					ret.in3.push_back(tuple.d);
				}
			}
		}
	}

	for (size_t ndx = 0; ndx < numSamples; ++ndx)
	{
		const typename In::In0	in0		= samplings.in0.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In1	in1		= samplings.in1.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In2	in2		= samplings.in2.genRandom(floatFormat, intPrecision, rnd);
		const typename In::In3	in3		= samplings.in3.genRandom(floatFormat, intPrecision, rnd);
		const InTuple<In>		tuple	(in0, in1, in2, in3);

		if (de::contains(seenInputs, tuple))
			continue;

		seenInputs.insert(tuple);
		ret.in0.push_back(in0);
		ret.in1.push_back(in1);
		ret.in2.push_back(in2);
		ret.in3.push_back(in3);
	}

	return ret;
}